

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ratectrl.c
# Opt level: O0

void av1_rc_init(AV1EncoderConfig *oxcf,RATE_CONTROL *rc)

{
  int iVar1;
  double in_RSI;
  double *in_RDI;
  RateControlCfg *rc_cfg;
  
  *(undefined4 *)((long)in_RSI + 0x30) = 8;
  *(undefined4 *)((long)in_RSI + 0x34) = *(undefined4 *)((long)in_RDI + 100);
  *(undefined4 *)((long)in_RSI + 0x18) = 0;
  *(undefined4 *)((long)in_RSI + 0x94) = *(undefined4 *)(in_RDI + 0x16);
  *(undefined4 *)((long)in_RSI + 0x98) = 0;
  *(undefined4 *)((long)in_RSI + 0x20) = *(undefined4 *)((long)in_RDI + 0x134);
  *(undefined4 *)((long)in_RSI + 0x24) = *(undefined4 *)(in_RDI + 0x27);
  if (*(int *)((long)in_RSI + 0x20) == 0) {
    iVar1 = av1_rc_get_default_min_gf_interval((int)rc_cfg,(int)((ulong)in_RDI >> 0x20),in_RSI);
    *(int *)((long)in_RSI + 0x20) = iVar1;
  }
  if (*(int *)((long)in_RSI + 0x24) == 0) {
    iVar1 = get_default_max_gf_interval(*in_RDI,*(int *)((long)in_RSI + 0x20));
    *(int *)((long)in_RSI + 0x24) = iVar1;
  }
  *(undefined4 *)((long)in_RSI + 0xd8) = 0;
  *(undefined4 *)((long)in_RSI + 0xf0) = 0;
  *(undefined4 *)((long)in_RSI + 0xf4) = 0;
  *(undefined4 *)((long)in_RSI + 0xf8) = 0;
  *(undefined4 *)((long)in_RSI + 0xfc) = 0;
  *(undefined4 *)((long)in_RSI + 0x100) = 0;
  *(undefined4 *)((long)in_RSI + 0x104) = 0;
  *(undefined4 *)((long)in_RSI + 0x138) = 0;
  *(undefined4 *)((long)in_RSI + 0xe4) = 0;
  *(undefined4 *)((long)in_RSI + 0xb0) = 0;
  *(undefined4 *)((long)in_RSI + 0xb4) = 0;
  *(undefined4 *)((long)in_RSI + 0x74) = 0;
  return;
}

Assistant:

void av1_rc_init(const AV1EncoderConfig *oxcf, RATE_CONTROL *rc) {
  const RateControlCfg *const rc_cfg = &oxcf->rc_cfg;

  rc->frames_since_key = 8;  // Sensible default for first frame.
  rc->frames_to_fwd_kf = oxcf->kf_cfg.fwd_kf_dist;

  rc->frames_till_gf_update_due = 0;
  rc->ni_av_qi = rc_cfg->worst_allowed_q;
  rc->ni_tot_qi = 0;

  rc->min_gf_interval = oxcf->gf_cfg.min_gf_interval;
  rc->max_gf_interval = oxcf->gf_cfg.max_gf_interval;
  if (rc->min_gf_interval == 0)
    rc->min_gf_interval = av1_rc_get_default_min_gf_interval(
        oxcf->frm_dim_cfg.width, oxcf->frm_dim_cfg.height,
        oxcf->input_cfg.init_framerate);
  if (rc->max_gf_interval == 0)
    rc->max_gf_interval = get_default_max_gf_interval(
        oxcf->input_cfg.init_framerate, rc->min_gf_interval);
  rc->avg_frame_low_motion = 0;

  rc->resize_state = ORIG;
  rc->resize_avg_qp = 0;
  rc->resize_buffer_underflow = 0;
  rc->resize_count = 0;
  rc->rtc_external_ratectrl = 0;
  rc->frame_level_fast_extra_bits = 0;
  rc->use_external_qp_one_pass = 0;
  rc->percent_blocks_inactive = 0;
  rc->force_max_q = 0;
  rc->postencode_drop = 0;
  rc->frames_since_scene_change = 0;
}